

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_CreateSignalIn(Cba_Ntk_t *p,Prs_Ntk_t *pNtk,int Sig)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Prs_ManType_t Type;
  int Value;
  int iFon;
  int Sig_local;
  Prs_Ntk_t *pNtk_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Abc_Lit2Var2(Sig);
  iVar2 = Abc_Lit2Att2(Sig);
  if (Sig == 0) {
    p_local._4_4_ = 0;
  }
  else if (iVar2 == 0) {
    pcVar3 = Prs_NtkStr(pNtk,iVar1);
    iVar1 = Cba_NtkNewStrId(p,pcVar3);
    p_local._4_4_ = Prs_CreateVerilogFindFon(p,iVar1);
  }
  else if (iVar2 == 2) {
    p_local._4_4_ = Cba_FonFromConst(iVar1);
  }
  else if (iVar2 == 1) {
    iVar2 = Prs_SliceName(pNtk,iVar1);
    pcVar3 = Prs_NtkStr(pNtk,iVar2);
    iVar2 = Cba_NtkNewStrId(p,pcVar3);
    iVar2 = Prs_CreateVerilogFindFon(p,iVar2);
    if (iVar2 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      iVar1 = Prs_SliceRange(pNtk,iVar1);
      p_local._4_4_ = Prs_CreateSlice(p,iVar2,pNtk,iVar1);
    }
  }
  else {
    if (iVar2 != 3) {
      __assert_fail("Type == CBA_PRS_CONCAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                    ,0x5d0,"int Prs_CreateSignalIn(Cba_Ntk_t *, Prs_Ntk_t *, int)");
    }
    p_local._4_4_ = Prs_CreateCatIn(p,pNtk,iVar1);
  }
  return p_local._4_4_;
}

Assistant:

int Prs_CreateSignalIn( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, int Sig )
{
    int iFon, Value = Abc_Lit2Var2( Sig );
    Prs_ManType_t Type = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    if ( !Sig ) return 0;
    if ( Type == CBA_PRS_NAME )
        return Prs_CreateVerilogFindFon( p, Cba_NtkNewStrId(p, Prs_NtkStr(pNtk, Value)) );
    if ( Type == CBA_PRS_CONST )
        return Cba_FonFromConst( Value );
    if ( Type == CBA_PRS_SLICE )
    {
        iFon =  Prs_CreateVerilogFindFon( p, Cba_NtkNewStrId(p, Prs_NtkStr(pNtk, Prs_SliceName(pNtk, Value))) );
        if ( !iFon )
            return 0;
        return Prs_CreateSlice( p, iFon, pNtk, Prs_SliceRange(pNtk, Value) );
    }
    assert( Type == CBA_PRS_CONCAT );
    return Prs_CreateCatIn( p, pNtk, Value );
}